

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O2

int uv__try_write(uv_stream_t *stream,uv_buf_t *bufs,uint nbufs,uv_stream_t *send_handle)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  undefined8 local_a0;
  undefined8 local_98;
  ulong local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  msghdr msg;
  
  uVar1 = uv__getiovmax();
  if ((int)uVar1 < (int)nbufs) {
    nbufs = uVar1;
  }
  if (send_handle == (uv_stream_t *)0x0) {
    do {
      iVar2 = (stream->io_watcher).fd;
      if (nbufs == 1) {
        uVar3 = write(iVar2,bufs->base,bufs->len);
      }
      else {
        uVar3 = writev(iVar2,(iovec *)bufs,nbufs);
      }
      if (uVar3 != 0xffffffffffffffff) goto LAB_00119c3c;
      piVar4 = __errno_location();
      iVar2 = *piVar4;
    } while (iVar2 == 4);
  }
  else {
    if ((send_handle->flags & 3) != 0) {
      uVar3 = 0xfffffffffffffff7;
      goto LAB_00119c5b;
    }
    uVar1 = uv__handle_fd((uv_handle_t *)send_handle);
    local_90 = 0;
    uStack_88 = 0;
    local_80 = 0;
    uStack_78 = 0;
    local_70 = 0;
    uStack_68 = 0;
    if ((int)uVar1 < 0) {
      __assert_fail("fd_to_send >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/stream.c"
                    ,0x34c,
                    "int uv__try_write(uv_stream_t *, const uv_buf_t *, unsigned int, uv_stream_t *)"
                   );
    }
    msg.msg_name = (void *)0x0;
    msg.msg_namelen = 0;
    msg.msg_iovlen = (size_t)(int)nbufs;
    msg.msg_flags = 0;
    msg.msg_control = &local_a0;
    msg.msg_controllen = 0x18;
    local_98 = 0x100000001;
    local_a0 = 0x14;
    local_90 = (ulong)uVar1;
    msg.msg_iov = (iovec *)bufs;
    do {
      uVar3 = sendmsg((stream->io_watcher).fd,(msghdr *)&msg,0);
      if (uVar3 != 0xffffffffffffffff) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
LAB_00119c3c:
    if (-1 < (long)uVar3) goto LAB_00119c5b;
    piVar4 = __errno_location();
    iVar2 = *piVar4;
  }
  uVar3 = 0xfffffffffffffff5;
  if ((iVar2 != 0xb) && (iVar2 != 0x69)) {
    uVar3 = (ulong)(uint)-iVar2;
  }
LAB_00119c5b:
  return (int)uVar3;
}

Assistant:

static int uv__try_write(uv_stream_t* stream,
                         const uv_buf_t bufs[],
                         unsigned int nbufs,
                         uv_stream_t* send_handle) {
  struct iovec* iov;
  int iovmax;
  int iovcnt;
  ssize_t n;

  /*
   * Cast to iovec. We had to have our own uv_buf_t instead of iovec
   * because Windows's WSABUF is not an iovec.
   */
  iov = (struct iovec*) bufs;
  iovcnt = nbufs;

  iovmax = uv__getiovmax();

  /* Limit iov count to avoid EINVALs from writev() */
  if (iovcnt > iovmax)
    iovcnt = iovmax;

  /*
   * Now do the actual writev. Note that we've been updating the pointers
   * inside the iov each time we write. So there is no need to offset it.
   */
  if (send_handle != NULL) {
    int fd_to_send;
    struct msghdr msg;
    struct cmsghdr *cmsg;
    union {
      char data[64];
      struct cmsghdr alias;
    } scratch;

    if (uv__is_closing(send_handle))
      return UV_EBADF;

    fd_to_send = uv__handle_fd((uv_handle_t*) send_handle);

    memset(&scratch, 0, sizeof(scratch));

    assert(fd_to_send >= 0);

    msg.msg_name = NULL;
    msg.msg_namelen = 0;
    msg.msg_iov = iov;
    msg.msg_iovlen = iovcnt;
    msg.msg_flags = 0;

    msg.msg_control = &scratch.alias;
    msg.msg_controllen = CMSG_SPACE(sizeof(fd_to_send));

    cmsg = CMSG_FIRSTHDR(&msg);
    cmsg->cmsg_level = SOL_SOCKET;
    cmsg->cmsg_type = SCM_RIGHTS;
    cmsg->cmsg_len = CMSG_LEN(sizeof(fd_to_send));

    /* silence aliasing warning */
    {
      void* pv = CMSG_DATA(cmsg);
      int* pi = pv;
      *pi = fd_to_send;
    }

    do
      n = sendmsg(uv__stream_fd(stream), &msg, 0);
    while (n == -1 && RETRY_ON_WRITE_ERROR(errno));
  } else {
    do
      n = uv__writev(uv__stream_fd(stream), iov, iovcnt);
    while (n == -1 && RETRY_ON_WRITE_ERROR(errno));
  }

  if (n >= 0)
    return n;

  if (IS_TRANSIENT_WRITE_ERROR(errno, send_handle))
    return UV_EAGAIN;

  return UV__ERR(errno);
}